

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O2

void __thiscall Assimp::RemoveVCProcess::Execute(RemoveVCProcess *this,aiScene *pScene)

{
  aiMaterial *paVar1;
  bool bVar2;
  uint uVar3;
  Logger *pLVar4;
  uint uVar5;
  uint uVar6;
  uint i;
  ulong uVar7;
  uint a;
  aiColor3D local_438;
  aiString s;
  
  pLVar4 = DefaultLogger::get();
  Logger::debug(pLVar4,"RemoveVCProcess begin");
  this->mScene = pScene;
  uVar3 = this->configDeleteFlags;
  uVar6 = (uVar3 & 0x40) >> 6;
  if ((uVar3 & 0x40) != 0) {
    ArrayDelete<aiAnimation>(&pScene->mAnimations,&pScene->mNumAnimations);
    uVar3 = this->configDeleteFlags;
  }
  if ((char)uVar3 < '\0') {
    ArrayDelete<aiTexture>(&pScene->mTextures,&pScene->mNumTextures);
    uVar3 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if (((uVar3 >> 0xb & 1) != 0) && (uVar5 = pScene->mNumMaterials, uVar5 != 0)) {
    for (uVar7 = 1; uVar7 < uVar5; uVar7 = uVar7 + 1) {
      paVar1 = pScene->mMaterials[uVar7];
      if (paVar1 != (aiMaterial *)0x0) {
        aiMaterial::~aiMaterial(paVar1);
      }
      operator_delete(paVar1);
      uVar5 = pScene->mNumMaterials;
    }
    pScene->mNumMaterials = 1;
    paVar1 = *pScene->mMaterials;
    if (paVar1 == (aiMaterial *)0x0) {
      __assert_fail("__null != helper",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/RemoveVCProcess.cpp"
                    ,0xb1,"virtual void Assimp::RemoveVCProcess::Execute(aiScene *)");
    }
    aiMaterial::Clear(paVar1);
    local_438.r = 0.6;
    local_438.g = 0.6;
    local_438.b = 0.6;
    aiMaterial::AddProperty(paVar1,&local_438,1,"$clr.diffuse",0,0);
    local_438.r = 0.05;
    local_438.g = 0.05;
    local_438.b = 0.05;
    aiMaterial::AddProperty(paVar1,&local_438,1,"$clr.ambient",0,0);
    s.length = 0;
    s.data[0] = '\0';
    memset(s.data + 1,0x1b,0x3ff);
    aiString::Set(&s,"Dummy_MaterialsRemoved");
    aiMaterial::AddProperty(paVar1,&s,"?mat.name",0,0);
    uVar3 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if ((uVar3 >> 8 & 1) != 0) {
    ArrayDelete<aiLight>(&pScene->mLights,&pScene->mNumLights);
    uVar3 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if ((uVar3 >> 9 & 1) != 0) {
    ArrayDelete<aiCamera>(&pScene->mCameras,&pScene->mNumCameras);
    uVar3 = this->configDeleteFlags;
    uVar6 = 1;
  }
  if ((uVar3 >> 10 & 1) == 0) {
    for (uVar7 = 0; uVar3 = pScene->mNumMeshes, uVar7 < uVar3; uVar7 = uVar7 + 1) {
      bVar2 = ProcessMesh(this,pScene->mMeshes[uVar7]);
      uVar6 = (uint)(byte)((byte)uVar6 | bVar2);
    }
  }
  else {
    ArrayDelete<aiMesh>(&pScene->mMeshes,&pScene->mNumMeshes);
    uVar3 = pScene->mNumMeshes;
    uVar6 = 1;
  }
  if ((uVar3 == 0) || (pScene->mNumMaterials == 0)) {
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
    pLVar4 = DefaultLogger::get();
    Logger::debug(pLVar4,"Setting AI_SCENE_FLAGS_INCOMPLETE flag");
    if (pScene->mNumMeshes == 0) {
      *(byte *)&pScene->mFlags = (byte)pScene->mFlags & 0xf7;
    }
  }
  pLVar4 = DefaultLogger::get();
  if (uVar6 == 0) {
    Logger::debug(pLVar4,"RemoveVCProcess finished. Nothing to be done ...");
  }
  else {
    Logger::info(pLVar4,"RemoveVCProcess finished. Data structure cleanup has been done.");
  }
  return;
}

Assistant:

void RemoveVCProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("RemoveVCProcess begin");
    bool bHas = false; //,bMasked = false;

    mScene = pScene;

    // handle animations
    if ( configDeleteFlags & aiComponent_ANIMATIONS)
    {

        bHas = true;
        ArrayDelete(pScene->mAnimations,pScene->mNumAnimations);
    }

    // handle textures
    if ( configDeleteFlags & aiComponent_TEXTURES)
    {
        bHas = true;
        ArrayDelete(pScene->mTextures,pScene->mNumTextures);
    }

    // handle materials
    if ( configDeleteFlags & aiComponent_MATERIALS && pScene->mNumMaterials)
    {
        bHas = true;
        for (unsigned int i = 1;i < pScene->mNumMaterials;++i)
            delete pScene->mMaterials[i];

        pScene->mNumMaterials = 1;
        aiMaterial* helper = (aiMaterial*) pScene->mMaterials[0];
        ai_assert(NULL != helper);
        helper->Clear();

        // gray
        aiColor3D clr(0.6f,0.6f,0.6f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);

        // add a small ambient color value
        clr = aiColor3D(0.05f,0.05f,0.05f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_AMBIENT);

        aiString s;
        s.Set("Dummy_MaterialsRemoved");
        helper->AddProperty(&s,AI_MATKEY_NAME);
    }

    // handle light sources
    if ( configDeleteFlags & aiComponent_LIGHTS)
    {
        bHas =  true;
        ArrayDelete(pScene->mLights,pScene->mNumLights);
    }

    // handle camneras
    if ( configDeleteFlags & aiComponent_CAMERAS)
    {
        bHas = true;
        ArrayDelete(pScene->mCameras,pScene->mNumCameras);
    }

    // handle meshes
    if (configDeleteFlags & aiComponent_MESHES)
    {
        bHas = true;
        ArrayDelete(pScene->mMeshes,pScene->mNumMeshes);
    }
    else
    {
        for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
        {
            if( ProcessMesh( pScene->mMeshes[a]))
                bHas = true;
        }
    }


    // now check whether the result is still a full scene
    if (!pScene->mNumMeshes || !pScene->mNumMaterials)
    {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
        ASSIMP_LOG_DEBUG("Setting AI_SCENE_FLAGS_INCOMPLETE flag");

        // If we have no meshes anymore we should also clear another flag ...
        if (!pScene->mNumMeshes)
            pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
    }

    if (bHas) {
        ASSIMP_LOG_INFO("RemoveVCProcess finished. Data structure cleanup has been done.");
    } else {
        ASSIMP_LOG_DEBUG("RemoveVCProcess finished. Nothing to be done ...");
    }
}